

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-getrandom.c
# Opt level: O0

int uv__random_getrandom(void *buf,size_t buflen)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  size_t sStack_30;
  int rc;
  size_t pos;
  ssize_t n;
  size_t buflen_local;
  void *buf_local;
  
  sStack_30 = 0;
  while( true ) {
    if (sStack_30 == buflen) {
      return 0;
    }
    do {
      pos = buflen - sStack_30;
      if (0x100 < (long)pos) {
        pos = 0x100;
      }
      sVar1 = uv__getrandom((void *)((long)buf + sStack_30),pos,0);
      bVar3 = false;
      if (sVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (sVar1 == -1) break;
    if (sVar1 == 0) {
      return -5;
    }
    sStack_30 = sVar1 + sStack_30;
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv__random_getrandom(void* buf, size_t buflen) {
  ssize_t n;
  size_t pos;
  int rc;

  rc = uv__random_getrandom_init();
  if (rc != 0)
    return rc;

  for (pos = 0; pos != buflen; pos += n) {
    do {
      n = buflen - pos;

      /* Most getrandom() implementations promise that reads <= 256 bytes
       * will always succeed and won't be interrupted by signals.
       * It's therefore useful to split it up in smaller reads because
       * one big read may, in theory, continuously fail with EINTR.
       */
      if (n > 256)
        n = 256;

      n = uv__getrandom((char *) buf + pos, n, 0);
    } while (n == -1 && errno == EINTR);

    if (n == -1)
      return UV__ERR(errno);

    if (n == 0)
      return UV_EIO;
  }

  return 0;
}